

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

int GetMapIndex(char *mapname,int lastindex,char *lumpname,bool needrequired)

{
  int iVar1;
  BYTE *__s1;
  ulong uVar2;
  checkstruct *__s2;
  
  __s1 = "";
  if (lumpname != (char *)0x0) {
    __s1 = (BYTE *)lumpname;
  }
  uVar2 = (ulong)(lastindex + 1);
  __s2 = GetMapIndex::check + uVar2;
  while( true ) {
    if (0xb < uVar2) {
      return -1;
    }
    iVar1 = strncasecmp((char *)__s1,__s2->lumpname,8);
    if (iVar1 == 0) break;
    if (__s2->required == true) {
      if (!needrequired) {
        return -2;
      }
      I_Error("\'%s\' not found in %s\n",__s2,mapname);
      return -2;
    }
    uVar2 = uVar2 + 1;
    __s2 = __s2 + 1;
  }
  return (int)uVar2;
}

Assistant:

static int GetMapIndex(const char *mapname, int lastindex, const char *lumpname, bool needrequired)
{
	static const checkstruct check[] = 
	{
		{"",		 true},
		{"THINGS",	 true},
		{"LINEDEFS", true},
		{"SIDEDEFS", true},
		{"VERTEXES", true},
		{"SEGS",	 false},
		{"SSECTORS", false},
		{"NODES",	 false},
		{"SECTORS",	 true},
		{"REJECT",	 false},
		{"BLOCKMAP", false},
		{"BEHAVIOR", false},
		//{"SCRIPTS",	 false},
	};

	if (lumpname==NULL) lumpname="";

	for(size_t i=lastindex+1;i<countof(check);i++)
	{
		if (!strnicmp(lumpname, check[i].lumpname, 8))
			return (int)i;

		if (check[i].required)
		{
			if (needrequired)
			{
				I_Error("'%s' not found in %s\n", check[i].lumpname, mapname);
			}
			return -2;
		}
	}

	return -1;	// End of map reached
}